

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O0

int lws_handle_POLLOUT_event(lws *wsi,pollfd *pollfd)

{
  char cVar1;
  int iVar2;
  int iVar3;
  lws_log_cx *plVar4;
  int eff;
  int n;
  lws *vwsi;
  pollfd *pollfd_local;
  lws *wsi_local;
  
  if ((*(ulong *)&wsi->field_0x46e >> 0xc & 1) != 0) {
    return 0;
  }
  wsi->leave_pollout_active = '\0';
  wsi->handling_pollout = '\x01';
  *(ulong *)&wsi->field_0x46e = *(ulong *)&wsi->field_0x46e & 0xffffdfffffffffff;
  iVar2 = lws_has_buffered_out(wsi);
  if (iVar2 == 0) {
    if ((wsi->wsistate & 0xffff) == 0x11e) {
      *(ulong *)&wsi->field_0x46e = *(ulong *)&wsi->field_0x46e & 0xffffffffffffefff | 0x1000;
    }
    else {
      if (wsi->role_ops == (lws_role_ops *)0x0) {
        __assert_fail("wsi->role_ops",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/service.c"
                      ,0x7a,"int lws_handle_POLLOUT_event(struct lws *, struct pollfd *)");
      }
      if (((int)(uint)wsi->role_ops->rops_idx[3] >> 4 == 0) ||
         (iVar2 = (**(code **)(((ulong)(wsi->role_ops->rops_idx[3] >> 1 & 0x78) - 8) +
                              (long)wsi->role_ops->rops_table))(), iVar2 == 0)) goto LAB_0011d6bf;
      if (iVar2 != 1) {
        if (1 < iVar2 - 2U) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/service.c"
                        ,0x8a,"int lws_handle_POLLOUT_event(struct lws *, struct pollfd *)");
        }
        if (pollfd != (pollfd *)0x0) {
          cVar1 = wsi->leave_pollout_active;
          if ((cVar1 == '\0') && (iVar3 = lws_change_pollfd(wsi,4,0), iVar3 != 0)) {
            plVar4 = lwsl_wsi_get_cx(wsi);
            _lws_log_cx(plVar4,lws_log_prepend_wsi,wsi,8,"lws_handle_POLLOUT_event",
                        "failed at set pollfd");
            goto LAB_0011d6de;
          }
          wsi->handling_pollout = '\0';
          if ((cVar1 == '\0') && (wsi->leave_pollout_active != '\0')) {
            plVar4 = lwsl_wsi_get_cx(wsi);
            _lws_log_cx(plVar4,lws_log_prepend_wsi,wsi,0x10,"lws_handle_POLLOUT_event",
                        "leave_pollout_active");
            iVar3 = lws_change_pollfd(wsi,0,4);
            if (iVar3 != 0) {
              plVar4 = lwsl_wsi_get_cx(wsi);
              _lws_log_cx(plVar4,lws_log_prepend_wsi,wsi,8,"lws_handle_POLLOUT_event",
                          "failed at set pollfd");
              goto LAB_0011d6de;
            }
          }
          wsi->leave_pollout_active = '\0';
        }
        if ((((((wsi->wsistate & 0x10000000) != 0) && ((*(ulong *)&wsi->field_0x46e & 1) == 0)) &&
             ((wsi->wsistate & 0xffff) != 0x10f)) && ((wsi->wsistate & 0xffff) != 0x14)) ||
           (iVar2 == 3)) {
LAB_0011d6bf:
          wsi->handling_pollout = '\0';
          wsi->leave_pollout_active = '\0';
          return 0;
        }
        if ((wsi->role_ops->rops_idx[3] & 0xf) == 0) {
          plVar4 = lwsl_wsi_get_cx(wsi);
          _lws_log_cx(plVar4,lws_log_prepend_wsi,wsi,0x10,"lws_handle_POLLOUT_event",
                      "non mux: wsistate 0x%lx, ops %s",(ulong)wsi->wsistate,wsi->role_ops->name);
          wsi->leave_pollout_active = '\0';
          iVar2 = lws_callback_as_writeable(wsi);
          wsi->handling_pollout = '\0';
          if (wsi->leave_pollout_active == '\0') {
            return iVar2;
          }
          iVar3 = lws_change_pollfd(wsi,0,4);
          if (iVar3 == 0) {
            return iVar2;
          }
        }
        else {
          iVar2 = (*wsi->role_ops->rops_table[(int)((wsi->role_ops->rops_idx[3] & 0xf) - 1)].
                    check_upgrades)(wsi);
          if (iVar2 != -1) goto LAB_0011d6bf;
        }
      }
    }
  }
  else {
    iVar2 = lws_issue_raw(wsi,(uchar *)0x0,0);
    if (-1 < iVar2) goto LAB_0011d6bf;
    plVar4 = lwsl_wsi_get_cx(wsi);
    _lws_log_cx(plVar4,lws_log_prepend_wsi,wsi,8,"lws_handle_POLLOUT_event","signalling to close");
  }
LAB_0011d6de:
  wsi->handling_pollout = '\0';
  wsi->leave_pollout_active = '\0';
  return -1;
}

Assistant:

int
lws_handle_POLLOUT_event(struct lws *wsi, struct lws_pollfd *pollfd)
{
	volatile struct lws *vwsi = (volatile struct lws *)wsi;
	int n;

	if (wsi->socket_is_permanently_unusable)
		return 0;

	vwsi->leave_pollout_active = 0;
	vwsi->handling_pollout = 1;
	/*
	 * if another thread wants POLLOUT on us, from here on while
	 * handling_pollout is set, he will only set leave_pollout_active.
	 * If we are going to disable POLLOUT, we will check that first.
	 */
	wsi->could_have_pending = 0; /* clear back-to-back write detection */

	/*
	 * user callback is lowest priority to get these notifications
	 * actually, since other pending things cannot be disordered
	 *
	 * Priority 1: pending truncated sends are incomplete ws fragments
	 *	       If anything else sent first the protocol would be
	 *	       corrupted.
	 *
	 *	       These are post- any compression transform
	 */

	if (lws_has_buffered_out(wsi)) {
		if (lws_issue_raw(wsi, NULL, 0) < 0) {
			lwsl_wsi_info(wsi, "signalling to close");
			goto bail_die;
		}
		/* leave POLLOUT active either way */
		goto bail_ok;
	} else
		if (lwsi_state(wsi) == LRS_FLUSHING_BEFORE_CLOSE) {
			wsi->socket_is_permanently_unusable = 1;
			goto bail_die; /* retry closing now */
		}

	/* Priority 2: pre- compression transform */

#if defined(LWS_WITH_HTTP_STREAM_COMPRESSION)
	if (wsi->http.comp_ctx.buflist_comp ||
	    wsi->http.comp_ctx.may_have_more) {
		enum lws_write_protocol wp = LWS_WRITE_HTTP;

		lwsl_wsi_info(wsi, "compl comp partial (buflist_comp %p, may %d)",
				   wsi->http.comp_ctx.buflist_comp,
				   wsi->http.comp_ctx.may_have_more);

		if (lws_rops_fidx(wsi->role_ops, LWS_ROPS_write_role_protocol) &&
		    lws_rops_func_fidx(wsi->role_ops, LWS_ROPS_write_role_protocol).
					write_role_protocol(wsi, NULL, 0, &wp) < 0) {
			lwsl_wsi_info(wsi, "signalling to close");
			goto bail_die;
		}
		lws_callback_on_writable(wsi);

		goto bail_ok;
	}
#endif

#ifdef LWS_WITH_CGI
	/*
	 * A cgi connection's wire protocol remains h1 or h2.  He is just
	 * getting his data from his child cgis.
	 */
	if (wsi->http.cgi) {
		/* also one shot */
		if (pollfd)
			if (lws_change_pollfd(wsi, LWS_POLLOUT, 0)) {
				lwsl_wsi_info(wsi, "failed at set pollfd");
				return 1;
			}
		goto user_service_go_again;
	}
#endif

	/* if we got here, we should have wire protocol ops set on the wsi */
	assert(wsi->role_ops);

	if (!lws_rops_fidx(wsi->role_ops, LWS_ROPS_handle_POLLOUT))
		goto bail_ok;

	n = lws_rops_func_fidx(wsi->role_ops, LWS_ROPS_handle_POLLOUT).
							handle_POLLOUT(wsi);
	switch (n) {
	case LWS_HP_RET_BAIL_OK:
		goto bail_ok;
	case LWS_HP_RET_BAIL_DIE:
		goto bail_die;
	case LWS_HP_RET_DROP_POLLOUT:
	case LWS_HP_RET_USER_SERVICE:
		break;
	default:
		assert(0);
	}

	/* one shot */

	if (pollfd) {
		int eff = vwsi->leave_pollout_active;

		if (!eff) {
			if (lws_change_pollfd(wsi, LWS_POLLOUT, 0)) {
				lwsl_wsi_info(wsi, "failed at set pollfd");
				goto bail_die;
			}
		}

		vwsi->handling_pollout = 0;

		/* cannot get leave_pollout_active set after the above */
		if (!eff && wsi->leave_pollout_active) {
			/*
			 * got set inbetween sampling eff and clearing
			 * handling_pollout, force POLLOUT on
			 */
			lwsl_wsi_debug(wsi, "leave_pollout_active");
			if (lws_change_pollfd(wsi, 0, LWS_POLLOUT)) {
				lwsl_wsi_info(wsi, "failed at set pollfd");
				goto bail_die;
			}
		}

		vwsi->leave_pollout_active = 0;
	}

	if (lwsi_role_client(wsi) && !wsi->hdr_parsing_completed &&
	     lwsi_state(wsi) != LRS_H2_WAITING_TO_SEND_HEADERS &&
	     lwsi_state(wsi) != LRS_ISSUE_HTTP_BODY)
		goto bail_ok;

	if (n == LWS_HP_RET_DROP_POLLOUT)
		goto bail_ok;


#ifdef LWS_WITH_CGI
user_service_go_again:
#endif

	if (lws_rops_fidx(wsi->role_ops, LWS_ROPS_perform_user_POLLOUT)) {
		if (lws_rops_func_fidx(wsi->role_ops,
				       LWS_ROPS_perform_user_POLLOUT).
						perform_user_POLLOUT(wsi) == -1)
			goto bail_die;
		else
			goto bail_ok;
	}

	lwsl_wsi_debug(wsi, "non mux: wsistate 0x%lx, ops %s",
			    (unsigned long)wsi->wsistate, wsi->role_ops->name);

	vwsi = (volatile struct lws *)wsi;
	vwsi->leave_pollout_active = 0;

	n = lws_callback_as_writeable(wsi);
	vwsi->handling_pollout = 0;

	if (vwsi->leave_pollout_active)
		if (lws_change_pollfd(wsi, 0, LWS_POLLOUT))
			goto bail_die;

	return n;

	/*
	 * since these don't disable the POLLOUT, they are always doing the
	 * right thing for leave_pollout_active whether it was set or not.
	 */

bail_ok:
	vwsi->handling_pollout = 0;
	vwsi->leave_pollout_active = 0;

	return 0;

bail_die:
	vwsi->handling_pollout = 0;
	vwsi->leave_pollout_active = 0;

	return -1;
}